

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::Combo(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter,
                 void *data,int items_count,int popup_max_height_in_items)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *item_text;
  char *preview_value;
  ImVec2 local_50;
  ImGuiContext *local_48;
  ImVec2 local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  local_48 = GImGui;
  iVar4 = *current_item;
  if (iVar4 < items_count && -1 < iVar4) {
    (*items_getter)(data,iVar4,&local_38);
  }
  if ((popup_max_height_in_items != -1) && (((local_48->NextWindowData).Flags & 0x10) == 0)) {
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_40.y = CalcMaxPopupHeightFromItemCount(popup_max_height_in_items);
    local_40.x = 3.4028235e+38;
    SetNextWindowSizeConstraints(&local_50,&local_40,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  iVar4 = 0;
  bVar2 = BeginCombo(label,local_38,0);
  if (bVar2) {
    if (items_count < 1) {
      items_count = 0;
    }
    bVar2 = false;
    for (; items_count != iVar4; iVar4 = iVar4 + 1) {
      PushID(iVar4);
      iVar1 = *current_item;
      bVar3 = (*items_getter)(data,iVar4,(char **)&local_50);
      if (!bVar3) {
        local_50 = (ImVec2)0x23434d;
      }
      local_40.x = 0.0;
      local_40.y = 0.0;
      bVar3 = Selectable((char *)local_50,iVar4 == iVar1,0,&local_40);
      if (bVar3) {
        *current_item = iVar4;
        bVar2 = true;
      }
      if (iVar4 == iVar1) {
        SetItemDefaultFocus();
      }
      PopID();
    }
    EndPopup();
    if (bVar2) {
      MarkItemEdited((local_48->LastItemData).ID);
      iVar4 = 1;
    }
    else {
      iVar4 = 0;
    }
  }
  return SUB41(iVar4,0);
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int popup_max_height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Call the getter to obtain the preview string which is a parameter to BeginCombo()
    const char* preview_value = NULL;
    if (*current_item >= 0 && *current_item < items_count)
        items_getter(data, *current_item, &preview_value);

    // The old Combo() API exposed "popup_max_height_in_items". The new more general BeginCombo() API doesn't have/need it, but we emulate it here.
    if (popup_max_height_in_items != -1 && !(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint))
        SetNextWindowSizeConstraints(ImVec2(0, 0), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));

    if (!BeginCombo(label, preview_value, ImGuiComboFlags_None))
        return false;

    // Display items
    // FIXME-OPT: Use clipper (but we need to disable it on the appearing frame to make sure our call to SetItemDefaultFocus() is processed)
    bool value_changed = false;
    for (int i = 0; i < items_count; i++)
    {
        PushID(i);
        const bool item_selected = (i == *current_item);
        const char* item_text;
        if (!items_getter(data, i, &item_text))
            item_text = "*Unknown item*";
        if (Selectable(item_text, item_selected))
        {
            value_changed = true;
            *current_item = i;
        }
        if (item_selected)
            SetItemDefaultFocus();
        PopID();
    }

    EndCombo();

    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}